

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
::operator()(arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
             *this,basic_string_view<char> value)

{
  basic_string_view<char> s;
  void *in_RCX;
  int in_EDX;
  basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *in_RSI;
  format_specs *in_RDI;
  iterator iVar1;
  undefined7 in_stack_ffffffffffffff98;
  ostream_type in_stack_ffffffffffffff9f;
  format_specs *spec;
  char *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  error_handler local_21 [33];
  
  if (in_RSI[1].out_._M_stream == (ostream_type *)0x0) {
    basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
    ::write(in_RSI,in_EDX,in_RCX,(size_t)in_RCX);
  }
  else {
    in_stack_ffffffffffffff9f = in_RSI[1].out_._M_stream[0x11];
    spec = in_RDI;
    error_handler::error_handler(local_21);
    check_string_type_spec<char,fmt::v5::internal::error_handler>
              ((char)((ulong)in_RDI >> 0x38),
               (error_handler *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    s.size_ = in_stack_ffffffffffffffc0;
    s.data_ = in_stack_ffffffffffffffb8;
    basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
    ::write<char>(in_RSI,s,spec);
    in_RDI = spec;
  }
  iVar1 = out((arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
               *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  iVar1._M_stream = (ostream_type *)in_RDI;
  return iVar1;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(
            specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }